

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

uint32 __thiscall
Js::IndexPropertyDescriptorMap::DeleteDownTo(IndexPropertyDescriptorMap *this,uint32 firstKey)

{
  uint uVar1;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  code *pcVar3;
  undefined4 *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int local_54;
  undefined4 *puStack_50;
  int i;
  IndexPropertyDescriptorMap *local_48;
  IndexPropertyDescriptor *local_40;
  IndexPropertyDescriptor *descriptor;
  
  EnsureIndexList(this);
  pBVar2 = (this->indexPropertyMap).ptr;
  iVar8 = pBVar2->count;
  uVar1 = pBVar2->freeCount;
  uVar6 = ~uVar1 + iVar8;
  if (-1 < (int)uVar6) {
    puStack_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    iVar8 = iVar8 - uVar1;
    uVar7 = (ulong)uVar6;
    local_48 = this;
    do {
      uVar1 = (this->indexList).ptr[uVar7];
      uVar6 = 2;
      if (firstKey <= uVar1) {
        descriptor._0_4_ = uVar1;
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetReference<unsigned_int>
                          ((this->indexPropertyMap).ptr,(uint *)&descriptor,&local_40,&local_54);
        if ((!bVar5) || (local_40 == (IndexPropertyDescriptor *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = puStack_50;
          *puStack_50 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0xbe,"(b && descriptor)","b && descriptor");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar4 = 0;
          this = local_48;
        }
        uVar6 = 4;
        if ((local_40->Attributes & 8) == 0) {
          if ((local_40->Attributes & 2) == 0) {
            descriptor._4_4_ = uVar1 + 1;
            uVar6 = 1;
          }
          else {
            (local_40->Getter).ptr = (void *)0x0;
            (local_40->Setter).ptr = (void *)0x0;
            local_40->Attributes = '\x0e';
            uVar6 = 0;
          }
        }
      }
      if ((uVar6 & 3) != 0) goto LAB_00dc550f;
      iVar8 = iVar8 + -1;
      uVar7 = uVar7 - 1;
    } while (0 < iVar8);
    uVar6 = 2;
LAB_00dc550f:
    if (uVar6 != 2) {
      firstKey = descriptor._4_4_;
    }
  }
  return firstKey;
}

Assistant:

uint32 IndexPropertyDescriptorMap::DeleteDownTo(uint32 firstKey)
    {
        EnsureIndexList();

        // Iterate the index list backwards to delete from right to left
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];
            if (key < firstKey)
            {
                break; // We are done, [firstKey, ...) have already been deleted
            }

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip empty entry
            }

            if (descriptor->Attributes & PropertyConfigurable)
            {
                descriptor->Getter = nullptr;
                descriptor->Setter = nullptr;
                descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            }
            else
            {
                // Cannot delete key, and [key + 1, ...) are all deleted
                return key + 1;
            }
        }

        return firstKey;
    }